

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O1

void __thiscall
bssl::HPKETest_SenderInvalidOpen_Test::TestBody(HPKETest_SenderInvalidOpen_Test *this)

{
  int iVar1;
  EVP_HPKE_KEM *kem;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  char *expected_predicate_value;
  AssertionResult gtest_ar__1;
  size_t cleartext_len;
  AssertionResult gtest_ar_;
  size_t enc_len;
  uint8_t kMockCiphertext [100];
  uint8_t cleartext [128];
  uint8_t enc [32];
  uint8_t public_key_r [32];
  uint8_t secret_key_r [32];
  ScopedEVP_HPKE_CTX sender_ctx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_488;
  Message local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_478;
  AssertHelper local_470;
  AssertHelper local_468;
  undefined1 local_460 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  size_t local_440;
  uint8_t local_438 [112];
  string local_3c8 [4];
  uint8_t local_348 [32];
  uint8_t local_328 [32];
  uint8_t local_308 [40];
  EVP_HPKE_CTX local_2e0;
  
  local_438[8] = '\0';
  local_438[9] = '\0';
  local_438[10] = '\0';
  local_438[0xb] = '\0';
  local_438[0xc] = '\0';
  local_438[0xd] = '\0';
  local_438[0xe] = '\0';
  local_438[0xf] = '\0';
  local_438[0x50] = '\0';
  local_438[0x51] = '\0';
  local_438[0x52] = '\0';
  local_438[0x53] = '\0';
  local_438[0x54] = '\0';
  local_438[0x55] = '\0';
  local_438[0x56] = '\0';
  local_438[0x57] = '\0';
  local_438[0x58] = '\0';
  local_438[0x59] = '\0';
  local_438[0x5a] = '\0';
  local_438[0x5b] = '\0';
  local_438[0x5c] = '\0';
  local_438[0x5d] = '\0';
  local_438[0x5e] = '\0';
  local_438[0x5f] = '\0';
  local_438[0x40] = '\0';
  local_438[0x41] = '\0';
  local_438[0x42] = '\0';
  local_438[0x43] = '\0';
  local_438[0x44] = '\0';
  local_438[0x45] = '\0';
  local_438[0x46] = '\0';
  local_438[0x47] = '\0';
  local_438[0x48] = '\0';
  local_438[0x49] = '\0';
  local_438[0x4a] = '\0';
  local_438[0x4b] = '\0';
  local_438[0x4c] = '\0';
  local_438[0x4d] = '\0';
  local_438[0x4e] = '\0';
  local_438[0x4f] = '\0';
  local_438[0x30] = '\0';
  local_438[0x31] = '\0';
  local_438[0x32] = '\0';
  local_438[0x33] = '\0';
  local_438[0x34] = '\0';
  local_438[0x35] = '\0';
  local_438[0x36] = '\0';
  local_438[0x37] = '\0';
  local_438[0x38] = '\0';
  local_438[0x39] = '\0';
  local_438[0x3a] = '\0';
  local_438[0x3b] = '\0';
  local_438[0x3c] = '\0';
  local_438[0x3d] = '\0';
  local_438[0x3e] = '\0';
  local_438[0x3f] = '\0';
  local_438[0x20] = '\0';
  local_438[0x21] = '\0';
  local_438[0x22] = '\0';
  local_438[0x23] = '\0';
  local_438[0x24] = '\0';
  local_438[0x25] = '\0';
  local_438[0x26] = '\0';
  local_438[0x27] = '\0';
  local_438[0x28] = '\0';
  local_438[0x29] = '\0';
  local_438[0x2a] = '\0';
  local_438[0x2b] = '\0';
  local_438[0x2c] = '\0';
  local_438[0x2d] = '\0';
  local_438[0x2e] = '\0';
  local_438[0x2f] = '\0';
  local_438[0x10] = '\0';
  local_438[0x11] = '\0';
  local_438[0x12] = '\0';
  local_438[0x13] = '\0';
  local_438[0x14] = '\0';
  local_438[0x15] = '\0';
  local_438[0x16] = '\0';
  local_438[0x17] = '\0';
  local_438[0x18] = '\0';
  local_438[0x19] = '\0';
  local_438[0x1a] = '\0';
  local_438[0x1b] = '\0';
  local_438[0x1c] = '\0';
  local_438[0x1d] = '\0';
  local_438[0x1e] = '\0';
  local_438[0x1f] = '\0';
  local_438[0x60] = '\0';
  local_438[0x61] = '\0';
  local_438[0x62] = '\0';
  local_438[99] = '\0';
  local_438[0] = 0xff;
  local_438[1] = '\0';
  local_438[2] = '\0';
  local_438[3] = '\0';
  local_438[4] = '\0';
  local_438[5] = '\0';
  local_438[6] = '\0';
  local_438[7] = '\0';
  X25519_keypair(local_328,local_308);
  EVP_HPKE_CTX_zero(&local_2e0);
  kem = EVP_hpke_x25519_hkdf_sha256();
  kdf = EVP_hpke_hkdf_sha256();
  aead = EVP_hpke_aes_128_gcm();
  iVar1 = EVP_HPKE_CTX_setup_sender
                    (&local_2e0,local_348,&local_440,0x20,kem,kdf,aead,local_328,0x20,(uint8_t *)0x0
                     ,0);
  local_460[0] = (internal)(iVar1 != 0);
  local_458 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_458;
    testing::Message::Message(&local_480);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_3c8,(internal *)local_460,
               (AssertionResult *)
               "EVP_HPKE_CTX_setup_sender( sender_ctx.get(), enc, &enc_len, sizeof(enc), EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(), EVP_hpke_aes_128_gcm(), public_key_r, sizeof(public_key_r), nullptr, 0)"
               ,"false","true",(char *)kdf);
    testing::internal::AssertHelper::AssertHelper
              (&local_470,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x234,local_3c8[0]._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_470,&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_470);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8[0]._M_dataplus._M_p != &local_3c8[0].field_2) {
      operator_delete(local_3c8[0]._M_dataplus._M_p,local_3c8[0].field_2._M_allocated_capacity + 1);
    }
    __ptr_00 = local_458;
    if ((long *)CONCAT71(local_480.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_480.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_480.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_480.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
      __ptr_00 = local_458;
    }
  }
  else {
    expected_predicate_value = &DAT_00000050;
    iVar1 = EVP_HPKE_CTX_open(&local_2e0,(uint8_t *)local_3c8,(size_t *)&local_470,0x80,local_438,
                              0x50,(uint8_t *)0x0,0);
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_478;
    local_480.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)(iVar1 == 0);
    local_478 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    __ptr_00 = local_478;
    if (!(bool)local_480.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) {
      testing::Message::Message((Message *)&local_488);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_460,(internal *)&local_480,
                 (AssertionResult *)
                 "EVP_HPKE_CTX_open(sender_ctx.get(), cleartext, &cleartext_len, sizeof(cleartext), kMockCiphertext, kMockCiphertextLen, nullptr, 0)"
                 ,"true","false",expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                (&local_468,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                 ,0x23b,(char *)CONCAT71(local_460._1_7_,local_460[0]));
      testing::internal::AssertHelper::operator=(&local_468,(Message *)&local_488);
      testing::internal::AssertHelper::~AssertHelper(&local_468);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_460._1_7_,local_460[0]) != &local_450) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_460._1_7_,local_460[0]),
                        local_450._M_allocated_capacity + 1);
      }
      __ptr_00 = local_478;
      if (local_488._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_488._M_head_impl + 8))();
        __ptr_00 = local_478;
      }
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_00,__ptr_00);
  }
  EVP_HPKE_CTX_cleanup(&local_2e0);
  return;
}

Assistant:

TEST(HPKETest, SenderInvalidOpen) {
  const uint8_t kMockCiphertext[100] = {0xff};
  const size_t kMockCiphertextLen = 80;

  // Generate the recipient's keypair.
  uint8_t secret_key_r[X25519_PRIVATE_KEY_LEN];
  uint8_t public_key_r[X25519_PUBLIC_VALUE_LEN];
  X25519_keypair(public_key_r, secret_key_r);

  // Set up the sender.
  ScopedEVP_HPKE_CTX sender_ctx;
  uint8_t enc[X25519_PUBLIC_VALUE_LEN];
  size_t enc_len;
  ASSERT_TRUE(EVP_HPKE_CTX_setup_sender(
      sender_ctx.get(), enc, &enc_len, sizeof(enc),
      EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(),
      EVP_hpke_aes_128_gcm(), public_key_r, sizeof(public_key_r), nullptr, 0));

  // Call Open() on the sender.
  uint8_t cleartext[128];
  size_t cleartext_len;
  ASSERT_FALSE(EVP_HPKE_CTX_open(sender_ctx.get(), cleartext, &cleartext_len,
                                 sizeof(cleartext), kMockCiphertext,
                                 kMockCiphertextLen, nullptr, 0));
}